

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O2

int Eso_ManFindDistOneLitNotEqual(int *pCube1,int *pCube2,int nLits)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = -1;
  do {
    if (nLits <= iVar2) {
      if (iVar1 != -1) {
        nLits = iVar1;
      }
      return nLits;
    }
    if (pCube1[iVar2] != *pCube2) {
      if (iVar1 != -1) {
        return -1;
      }
      iVar1 = iVar2;
      iVar2 = iVar2 + -1;
    }
    iVar2 = iVar2 + 1;
    pCube2 = pCube2 + 1;
  } while( true );
}

Assistant:

int Eso_ManFindDistOneLitNotEqual( int * pCube1, int * pCube2, int nLits ) // pCube1 has nLits; pCube2 has nLits + 1
{
    int i, k, iDiff = -1;
    for ( i = k = 0; i < nLits; i++, k++ )
        if ( pCube1[i] != pCube2[k] )
        {
            if ( iDiff != -1 )
                return -1;
            iDiff = i;
            i--;
        }
    if ( iDiff == -1 )
        iDiff = nLits;
    return iDiff;
}